

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O0

void __thiscall
kratos::FSMState::output
          (FSMState *this,shared_ptr<kratos::Var> *output_var,shared_ptr<kratos::Var> *value_var)

{
  initializer_list<const_kratos::IRNode_*> __l;
  bool bVar1;
  mapped_type *ppVVar2;
  v7 *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  undefined1 auVar3 [16];
  format_args args;
  string_view format_str;
  allocator<const_kratos::IRNode_*> local_111;
  mapped_type local_110;
  mapped_type *local_108;
  size_type local_100;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_f8;
  string local_d0;
  _Base_ptr local_b0;
  _Self local_a8;
  element_type *local_a0;
  element_type *value;
  element_type *output;
  shared_ptr<kratos::Var> *value_var_local;
  shared_ptr<kratos::Var> *output_var_local;
  FSMState *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_70;
  basic_string_view<char> local_68;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_58;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_48;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *vargs;
  string *local_38;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_10;
  
  output = (element_type *)value_var;
  value_var_local = output_var;
  output_var_local = (shared_ptr<kratos::Var> *)this;
  value = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                    (&output_var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>);
  local_a0 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)output);
  local_a8._M_node =
       (_Base_ptr)
       std::
       map<kratos::Var_*,_kratos::Var_*,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
       ::find(&this->output_values_,&value);
  local_b0 = (_Base_ptr)
             std::
             map<kratos::Var_*,_kratos::Var_*,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
             ::end(&this->output_values_);
  this_00 = (v7 *)&local_b0;
  bVar1 = std::operator!=(&local_a8,(_Self *)this_00);
  if (!bVar1) {
    std::vector<kratos::Var*,std::allocator<kratos::Var*>>::emplace_back<kratos::Var*&>
              ((vector<kratos::Var*,std::allocator<kratos::Var*>> *)&this->output_ordering_,&value);
    std::
    map<kratos::Var*,kratos::Var*,std::less<kratos::Var*>,std::allocator<std::pair<kratos::Var*const,kratos::Var*>>>
    ::emplace<kratos::Var*&,kratos::Var*&>
              ((map<kratos::Var*,kratos::Var*,std::less<kratos::Var*>,std::allocator<std::pair<kratos::Var*const,kratos::Var*>>>
                *)&this->output_values_,&value,&local_a0);
    return;
  }
  auVar3 = __cxa_allocate_exception(0x10);
  local_38 = &local_d0;
  vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
           *)anon_var_dwarf_3d2ee6;
  local_58.named_args.data =
       (named_arg_info<char> *)
       fmt::v7::make_args_checked<,char[33],char>
                 ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                   *)"{0} already has specified output",this_00,auVar3._8_8_);
  local_48 = &local_58;
  local_68 = fmt::v7::to_string_view<char,_0>((char *)vargs);
  local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              *)&this_local;
  local_30 = local_48;
  local_20 = local_48;
  local_10 = local_48;
  local_18 = local_28;
  fmt::v7::
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args(local_28,0,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)&local_48->string);
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_70.values_;
  format_str.size_ = (size_t)this_local;
  format_str.data_ = (char *)local_68.size_;
  fmt::v7::detail::vformat_abi_cxx11_(&local_d0,(detail *)local_68.data_,format_str,args);
  ppVVar2 = std::
            map<kratos::Var_*,_kratos::Var_*,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
            ::at(&this->output_values_,&value);
  local_110 = *ppVVar2;
  local_108 = &local_110;
  local_100 = 1;
  std::allocator<const_kratos::IRNode_*>::allocator(&local_111);
  __l._M_len = local_100;
  __l._M_array = (iterator)local_108;
  std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
            (&local_f8,__l,&local_111);
  VarException::VarException(auVar3._0_8_,&local_d0,&local_f8);
  __cxa_throw(auVar3._0_8_,&VarException::typeinfo,VarException::~VarException);
}

Assistant:

void FSMState::output(const std::shared_ptr<Var>& output_var,
                      const std::shared_ptr<Var>& value_var) {
    auto* output = output_var.get();
    auto* value = value_var.get();
    if (output_values_.find(output) != output_values_.end()) {
        throw VarException(::format("{0} already has specified output"),
                           {output_values_.at(output)});
    }
    output_ordering_.emplace_back(output);
    output_values_.emplace(output, value);
}